

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::BerdySparseMAPSolverPimpl
          (BerdySparseMAPSolverPimpl *this,BerdyHelper *berdyHelper)

{
  this->berdy = berdyHelper;
  this->valid = false;
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::VectorDynSize::VectorDynSize(&this->priorDynamicsRegularizationExpectedValue);
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::VectorDynSize::VectorDynSize(&this->dynamicsConstraintsBias);
  iDynTree::VectorDynSize::VectorDynSize(&this->measurementsBias);
  iDynTree::JointPosDoubleArray::JointPosDoubleArray(&this->jointsConfiguration,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray(&this->jointsVelocity,0);
  iDynTree::VectorDynSize::VectorDynSize(&this->measurements);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsPrior);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&this->covarianceDynamicsPriorInverse);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsPriorRHS);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsAPosteriori);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&this->covarianceDynamicsAPosterioriInverse);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsAPosterioriRHS);
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::SimplicialCholeskyBase
            (&(this->covarianceDynamicsPriorInverseDecomposition).
              super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            );
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::SimplicialCholeskyBase
            (&(this->covarianceDynamicsAPosterioriInverseDecomposition).
              super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            );
  initialize(this);
  return;
}

Assistant:

BerdySparseMAPSolverPimpl(BerdyHelper& berdyHelper)
        : berdy(berdyHelper)
        , valid(false)
        {
            initialize();
        }